

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

size_t __thiscall
pbrt::BufferCache<pbrt::Vector3<float>_>::BufferHasher::operator()(BufferHasher *this,Buffer *b)

{
  uint64_t uVar1;
  void *in_RSI;
  size_t in_stack_ffffffffffffffe8;
  
  uVar1 = HashBuffer(in_RSI,in_stack_ffffffffffffffe8,0x51a2f8);
  return uVar1;
}

Assistant:

size_t operator()(const Buffer &b) const { return HashBuffer(b.ptr, b.size); }